

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall ieee754::is_zero(ieee754 *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = (long)this->bytes - 1;
  uVar1 = 0;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = uVar2 & 0xffffffff;
  }
  iVar4 = 0;
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    iVar4 = iVar4 + (uint)this->buf[uVar1];
  }
  if (iVar4 != 0) {
    return 0;
  }
  return (int)((this->buf[uVar2] & 0x7f) == 0);
}

Assistant:

int is_zero() const
    {
        /* 
         *   a zero is represented by all bits zero except possibly the sign
         *   bit, which is 0 for +0 and 1 for -0 
         */
        int sum = 0;
        for (int i = 0 ; i < bytes - 1 ; ++i)
            sum += buf[i];

        return sum == 0 && (buf[bytes-1] & 0x7f) == 0;
    }